

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_invtestUnits_Test::TestBody(unitStrings_invtestUnits_Test *this)

{
  bool bVar1;
  precise_unit *un;
  char *message;
  uint64_t in_RCX;
  AssertHelper local_90;
  Message local_88 [3];
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  string res;
  precise_unit local_30;
  undefined1 local_20 [8];
  precise_unit funit;
  unitStrings_invtestUnits_Test *this_local;
  
  funit._8_8_ = this;
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator/
                 ((precise_unit *)units::precise::one,(precise_unit *)units::precise::cd);
  local_30 = units::precise_unit::operator/
                       ((precise_unit *)((long)&res.field_2 + 8),
                        (precise_unit *)units::precise::time::day);
  units::precise_unit::precise_unit((precise_unit *)local_20,1e-06,&local_30);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar.message_,(units *)local_20,un,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_70,"res","\"1/(Mcd*day)\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [12])"1/(Mcd*day)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x13f,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, invtestUnits)
{
    auto funit =
        precise_unit(0.000001, precise::one / precise::cd / precise::time::day);
    auto res = to_string(funit);
    EXPECT_EQ(res, "1/(Mcd*day)");
}